

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O0

mraa_result_t mraa_pwm_unexport(mraa_pwm_context dev)

{
  mraa_pwm_context dev_local;
  
  if (dev == (mraa_pwm_context)0x0) {
    syslog(3,"pwm: unexport: context is NULL");
    dev_local._4_4_ = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    mraa_pwm_enable(dev,0);
    if (dev->owner == 0) {
      dev_local._4_4_ = MRAA_ERROR_INVALID_PARAMETER;
    }
    else {
      dev_local._4_4_ = mraa_pwm_unexport_force(dev);
    }
  }
  return dev_local._4_4_;
}

Assistant:

mraa_result_t
mraa_pwm_unexport(mraa_pwm_context dev)
{
    if (!dev) {
        syslog(LOG_ERR, "pwm: unexport: context is NULL");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    mraa_pwm_enable(dev, 0);
    if (dev->owner) {
        return mraa_pwm_unexport_force(dev);
    }
    return MRAA_ERROR_INVALID_PARAMETER;
}